

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::NewArrayExpressionSyntax::setChild
          (NewArrayExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  ParenthesizedExpressionSyntax *pPVar2;
  logic_error *this_00;
  Token TVar3;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 5) {
    switch(index) {
    case 0:
      pSVar1 = TokenOrSyntax::node(&child);
      if (pSVar1 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar1 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::NameSyntax>(pSVar1);
      }
      not_null<slang::syntax::NameSyntax*>::not_null<slang::syntax::NameSyntax*,void>
                ((not_null<slang::syntax::NameSyntax*> *)&local_b8,(NameSyntax **)&local_d8);
      (this->newKeyword).ptr = (NameSyntax *)local_b8._M_dataplus._M_p;
      break;
    case 1:
      TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->openBracket).kind = TVar3.kind;
      (this->openBracket).field_0x2 = TVar3._2_1_;
      (this->openBracket).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
      (this->openBracket).rawLen = TVar3.rawLen;
      (this->openBracket).info = TVar3.info;
      break;
    case 2:
      pSVar1 = TokenOrSyntax::node(&child);
      if (pSVar1 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar1 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar1)
        ;
      }
      not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
                ((not_null<slang::syntax::ExpressionSyntax*> *)&local_b8,
                 (ExpressionSyntax **)&local_d8);
      (this->sizeExpr).ptr = (ExpressionSyntax *)local_b8._M_dataplus._M_p;
      break;
    case 3:
      TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->closeBracket).kind = TVar3.kind;
      (this->closeBracket).field_0x2 = TVar3._2_1_;
      (this->closeBracket).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
      (this->closeBracket).rawLen = TVar3.rawLen;
      (this->closeBracket).info = TVar3.info;
      break;
    case 4:
      pSVar1 = TokenOrSyntax::node(&child);
      if (pSVar1 == (SyntaxNode *)0x0) {
        pPVar2 = (ParenthesizedExpressionSyntax *)0x0;
      }
      else {
        pSVar1 = TokenOrSyntax::node(&child);
        pPVar2 = SyntaxNode::as<slang::syntax::ParenthesizedExpressionSyntax>(pSVar1);
      }
      this->initializer = pPVar2;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string(&local_98,0x2340);
  std::operator+(&local_38,&local_58,&local_98);
  std::operator+(&local_d8,&local_38,": ");
  std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void NewArrayExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: newKeyword = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 1: openBracket = child.token(); return;
        case 2: sizeExpr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: closeBracket = child.token(); return;
        case 4: initializer = child.node() ? &child.node()->as<ParenthesizedExpressionSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}